

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

_Bool ipv4_normalize(char *hostname,char *outp,size_t olen)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  unsigned_long l;
  char *endp;
  unsigned_long parts [4];
  char *c;
  int n;
  _Bool done;
  size_t olen_local;
  char *outp_local;
  char *hostname_local;
  
  bVar1 = false;
  c._0_4_ = 0;
  parts[3] = (unsigned_long)hostname;
  memset(&endp,0,0x20);
  while( true ) {
    if (bVar1) {
      switch((int)c) {
      case 0:
        curl_msnprintf(outp,olen,"%u.%u.%u.%u",(ulong)endp >> 0x18,(ulong)endp >> 0x10 & 0xff,
                       (ulong)endp >> 8 & 0xff,(ulong)endp & 0xff);
        break;
      case 1:
        if (((char *)0xff < endp) || (0xffffff < parts[0])) {
          return false;
        }
        curl_msnprintf(outp,olen,"%u.%u.%u.%u",endp,parts[0] >> 0x10 & 0xff,parts[0] >> 8 & 0xff,
                       parts[0] & 0xff);
        break;
      case 2:
        if ((((char *)0xff < endp) || (0xff < parts[0])) || (0xffff < parts[1])) {
          return false;
        }
        curl_msnprintf(outp,olen,"%u.%u.%u.%u",endp,parts[0],parts[1] >> 8 & 0xff,parts[1] & 0xff);
        break;
      case 3:
        if ((((char *)0xff < endp) || (0xff < parts[0])) || ((0xff < parts[1] || (0xff < parts[2])))
           ) {
          return false;
        }
        curl_msnprintf(outp,olen,"%u.%u.%u.%u",endp,parts[0],parts[1],parts[2]);
      }
      return true;
    }
    if ((*(char *)parts[3] < '0') || ('9' < *(char *)parts[3])) {
      return false;
    }
    uVar2 = strtoul((char *)parts[3],(char **)&l,0);
    if (((uVar2 == 0xffffffffffffffff) && (piVar3 = __errno_location(), *piVar3 == 0x22)) ||
       (l == parts[3])) break;
    if (0xffffffff < uVar2) {
      return false;
    }
    parts[(long)(int)c + -1] = uVar2;
    parts[3] = l;
    if (*(char *)l == '\0') {
      bVar1 = true;
    }
    else {
      if (*(char *)l != '.') {
        return false;
      }
      if ((int)c == 3) {
        return false;
      }
      c._0_4_ = (int)c + 1;
      parts[3] = l + 1;
    }
  }
  return false;
}

Assistant:

static bool ipv4_normalize(const char *hostname, char *outp, size_t olen)
{
  bool done = FALSE;
  int n = 0;
  const char *c = hostname;
  unsigned long parts[4] = {0, 0, 0, 0};

  while(!done) {
    char *endp;
    unsigned long l;
    if((*c < '0') || (*c > '9'))
      /* most importantly this doesn't allow a leading plus or minus */
      return FALSE;
    l = strtoul(c, &endp, 0);

    /* overflow or nothing parsed at all */
    if(((l == ULONG_MAX) && (errno == ERANGE)) ||  (endp == c))
      return FALSE;

#if SIZEOF_LONG > 4
    /* a value larger than 32 bits */
    if(l > UINT_MAX)
      return FALSE;
#endif

    parts[n] = l;
    c = endp;

    switch (*c) {
    case '.' :
      if(n == 3)
        return FALSE;
      n++;
      c++;
      break;

    case '\0':
      done = TRUE;
      break;

    default:
      return FALSE;
    }
  }

  /* this is deemed a valid IPv4 numerical address */

  switch(n) {
  case 0: /* a -- 32 bits */
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0] >> 24, (parts[0] >> 16) & 0xff,
              (parts[0] >> 8) & 0xff, parts[0] & 0xff);
    break;
  case 1: /* a.b -- 8.24 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xffffff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], (parts[1] >> 16) & 0xff,
              (parts[1] >> 8) & 0xff, parts[1] & 0xff);
    break;
  case 2: /* a.b.c -- 8.8.16 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xffff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], parts[1], (parts[2] >> 8) & 0xff,
              parts[2] & 0xff);
    break;
  case 3: /* a.b.c.d -- 8.8.8.8 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xff) ||
       (parts[3] > 0xff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], parts[1], parts[2], parts[3]);
    break;
  }
  return TRUE;
}